

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3_column_value(sqlite3_stmt *pStmt,int i)

{
  Mem *pMVar1;
  Mem *pOut;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  pMVar1 = columnMem(pStmt,i);
  if ((pMVar1->flags & 0x800) != 0) {
    pMVar1->flags = pMVar1->flags & 0xf7ff;
    pMVar1->flags = pMVar1->flags | 0x1000;
  }
  columnMallocFailure(pStmt);
  return pMVar1;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_column_value(sqlite3_stmt *pStmt, int i){
  Mem *pOut = columnMem(pStmt, i);
  if( pOut->flags&MEM_Static ){
    pOut->flags &= ~MEM_Static;
    pOut->flags |= MEM_Ephem;
  }
  columnMallocFailure(pStmt);
  return (sqlite3_value *)pOut;
}